

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

void __thiscall absl::lts_20250127::status_internal::StatusRep::Unref(StatusRep *this)

{
  int iVar1;
  StatusRep *this_local;
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  if ((this->ref_).super___atomic_base<int>._M_i != 1) {
    LOCK();
    iVar1 = (this->ref_).super___atomic_base<int>._M_i;
    (this->ref_).super___atomic_base<int>._M_i = (this->ref_).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (iVar1 != 1) {
      return;
    }
  }
  if (this != (StatusRep *)0x0) {
    ~StatusRep(this);
    operator_delete(this,0x30);
  }
  return;
}

Assistant:

void StatusRep::Unref() const {
  // Fast path: if ref==1, there is no need for a RefCountDec (since
  // this is the only reference and therefore no other thread is
  // allowed to be mucking with r).
  if (ref_.load(std::memory_order_acquire) == 1 ||
      ref_.fetch_sub(1, std::memory_order_acq_rel) - 1 == 0) {
    delete this;
  }
}